

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O3

void __thiscall RasterizerA2::RasterizerA2(RasterizerA2 *this,Image *dst,uint32_t options)

{
  CellRasterizer::CellRasterizer(&this->super_CellRasterizer,dst,options);
  (this->super_CellRasterizer).super_Rasterizer._vptr_Rasterizer =
       (_func_int **)&PTR__RasterizerA2_00131bc0;
  this->_cellStride = 0;
  this->_cells = (Cell *)0x0;
  this->_xBounds = (Bounds *)0x0;
  (this->_yBounds).start = 0;
  (this->_yBounds).end = 0;
  (this->super_CellRasterizer).super_Rasterizer._name[0] = 'A';
  (this->super_CellRasterizer).super_Rasterizer._name[1] = '2';
  (this->super_CellRasterizer).super_Rasterizer._name[2] = '\0';
  Rasterizer::addOptionsToName((Rasterizer *)this);
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)dst->_width);
  return;
}

Assistant:

RasterizerA2::RasterizerA2(Image& dst, uint32_t options) noexcept
  : CellRasterizer(dst, options),
    _cellStride(0),
    _cells(nullptr),
    _xBounds(nullptr),
    _yBounds { 0, 0 } {
  std::snprintf(_name, ARRAY_SIZE(_name), "A2");
  addOptionsToName();
  init(dst.width(), dst.height());
}